

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O2

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
DisconnectedBlockTransactions::AddTransactionsFromBlock
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,DisconnectedBlockTransactions *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx)

{
  long lVar1;
  pointer psVar2;
  size_t sVar3;
  shared_ptr<const_CTransaction> *__x;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_false,_true>,_bool>
  pVar4;
  iterator it;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__detail::
  _Rehash_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&this->iters_by_txid,
            ((long)(vtx->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtx->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) +
            (this->iters_by_txid)._M_h._M_element_count);
  psVar2 = (vtx->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    __x = psVar2 + -1;
    if (psVar2 == (vtx->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) {
      LimitMemoryUsage(__return_storage_ptr__,this);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    it = std::__cxx11::
         list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ::insert(&this->queuedTx,(const_iterator)&this->queuedTx,__x);
    pVar4 = std::
            _Hashtable<uint256,std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>,std::allocator<std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<transaction_identifier<false>const&,std::_List_iterator<std::shared_ptr<CTransaction_const>>&>
                      ((_Hashtable<uint256,std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>,std::allocator<std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->iters_by_txid,
                       &((__x->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->hash,&it);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    sVar3 = RecursiveDynamicUsage<CTransaction_const>(__x);
    this->cachedInnerUsage = this->cachedInnerUsage + sVar3;
    psVar2 = __x;
  }
  __assert_fail("inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/disconnected_transactions.cpp"
                ,0x37,
                "std::vector<CTransactionRef> DisconnectedBlockTransactions::AddTransactionsFromBlock(const std::vector<CTransactionRef> &)"
               );
}

Assistant:

[[nodiscard]] std::vector<CTransactionRef> DisconnectedBlockTransactions::AddTransactionsFromBlock(const std::vector<CTransactionRef>& vtx)
{
    iters_by_txid.reserve(iters_by_txid.size() + vtx.size());
    for (auto block_it = vtx.rbegin(); block_it != vtx.rend(); ++block_it) {
        auto it = queuedTx.insert(queuedTx.end(), *block_it);
        auto [_, inserted] = iters_by_txid.emplace((*block_it)->GetHash(), it);
        assert(inserted); // callers may never pass multiple transactions with the same txid
        cachedInnerUsage += RecursiveDynamicUsage(*block_it);
    }
    return LimitMemoryUsage();
}